

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O2

type * __thiscall
duckdb::Deserializer::
Read<std::set<unsigned_long,std::less<unsigned_long>,std::allocator<unsigned_long>>>
          (type *__return_storage_ptr__,Deserializer *this)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  unsigned_long in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar3;
  bool bVar4;
  unsigned_long local_28;
  
  local_28 = in_RAX;
  iVar2 = (*this->_vptr_Deserializer[8])(this);
  lVar3 = CONCAT44(extraout_var,iVar2);
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  while (bVar4 = lVar3 != 0, lVar3 = lVar3 + -1, bVar4) {
    iVar2 = (*this->_vptr_Deserializer[0x15])(this);
    local_28 = CONCAT44(extraout_var_00,iVar2);
    ::std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::_M_insert_unique<unsigned_long>(&__return_storage_ptr__->_M_t,&local_28);
  }
  (*this->_vptr_Deserializer[9])(this);
  return __return_storage_ptr__;
}

Assistant:

inline typename std::enable_if<is_set<T>::value, T>::type Read() {
		using ELEMENT_TYPE = typename is_set<T>::ELEMENT_TYPE;
		auto size = OnListBegin();
		T set;
		for (idx_t i = 0; i < size; i++) {
			set.insert(Read<ELEMENT_TYPE>());
		}
		OnListEnd();
		return set;
	}